

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::level_formatter<spdlog::details::null_scoped_padder>::format
          (level_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  void *__src;
  size_t __n;
  long lVar1;
  ptrdiff_t _Num;
  char *buf_ptr;
  ulong uVar2;
  
  lVar1 = (ulong)msg->level * 0x10;
  __src = *(void **)(level::level_string_views + lVar1);
  if (__src != (void *)0x0) {
    __n = *(size_t *)(level::level_string_views + lVar1 + 8);
    uVar2 = (dest->super_buffer<char>).size_ + __n;
    if ((dest->super_buffer<char>).capacity_ < uVar2) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar2);
    }
    if (__n != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
    }
    (dest->super_buffer<char>).size_ = uVar2;
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        string_view_t &level_name = level::to_string_view(msg.level);
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }